

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O3

void opj_calculate_norms(OPJ_FLOAT64 *pNorms,OPJ_UINT32 pNbComps,OPJ_FLOAT32 *pMatrix)

{
  float *pfVar1;
  OPJ_UINT32 OVar2;
  ulong uVar3;
  OPJ_FLOAT32 *lMatrix;
  OPJ_FLOAT64 *lNorms;
  ulong uVar4;
  double __x;
  OPJ_FLOAT64 OVar5;
  
  if (pNbComps != 0) {
    uVar4 = 0;
    do {
      uVar3 = uVar4 & 0xffffffff;
      __x = 0.0;
      OVar2 = pNbComps;
      do {
        pfVar1 = (float *)(pMatrix + uVar3);
        uVar3 = (ulong)((int)uVar3 + pNbComps);
        __x = __x + (double)(*pfVar1 * *pfVar1);
        OVar2 = OVar2 - 1;
      } while (OVar2 != 0);
      if (__x < 0.0) {
        OVar5 = (OPJ_FLOAT64)sqrt(__x);
      }
      else {
        OVar5 = (OPJ_FLOAT64)SQRT(__x);
      }
      pNorms[uVar4] = OVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 != pNbComps);
  }
  return;
}

Assistant:

void opj_calculate_norms(OPJ_FLOAT64 * pNorms,
                         OPJ_UINT32 pNbComps,
                         OPJ_FLOAT32 * pMatrix)
{
    OPJ_UINT32 i, j, lIndex;
    OPJ_FLOAT32 lCurrentValue;
    OPJ_FLOAT64 * lNorms = (OPJ_FLOAT64 *) pNorms;
    OPJ_FLOAT32 * lMatrix = (OPJ_FLOAT32 *) pMatrix;

    for (i = 0; i < pNbComps; ++i) {
        lNorms[i] = 0;
        lIndex = i;

        for (j = 0; j < pNbComps; ++j) {
            lCurrentValue = lMatrix[lIndex];
            lIndex += pNbComps;
            lNorms[i] += lCurrentValue * lCurrentValue;
        }
        lNorms[i] = sqrt(lNorms[i]);
    }
}